

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_remove_bundle(cpool *cpool,cpool_bundle *bundle)

{
  Curl_hash_element *local_38;
  Curl_hash_element *he;
  Curl_hash_iterator iter;
  cpool_bundle *bundle_local;
  cpool *cpool_local;
  
  if (cpool != (cpool *)0x0) {
    iter.current_element = (Curl_llist_node *)bundle;
    Curl_hash_start_iterate(&cpool->dest2bundle,(Curl_hash_iterator *)&he);
    local_38 = Curl_hash_next_element((Curl_hash_iterator *)&he);
    while (local_38 != (Curl_hash_element *)0x0) {
      if ((Curl_llist_node *)local_38->ptr == iter.current_element) {
        Curl_hash_delete(&cpool->dest2bundle,local_38->key,local_38->key_len);
        return;
      }
      local_38 = Curl_hash_next_element((Curl_hash_iterator *)&he);
    }
  }
  return;
}

Assistant:

static void cpool_remove_bundle(struct cpool *cpool,
                                struct cpool_bundle *bundle)
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;

  if(!cpool)
    return;

  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    if(he->ptr == bundle) {
      /* The bundle is destroyed by the hash destructor function,
         free_bundle_hash_entry() */
      Curl_hash_delete(&cpool->dest2bundle, he->key, he->key_len);
      return;
    }

    he = Curl_hash_next_element(&iter);
  }
}